

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LoadConstantLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_loadconstant(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x122) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x122;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    LoadConstantLayerParams::LoadConstantLayerParams(this_00.loadconstant_);
    (this->layer_).loadconstant_ = (LoadConstantLayerParams *)this_00;
  }
  return (LoadConstantLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LoadConstantLayerParams* NeuralNetworkLayer::mutable_loadconstant() {
  if (!has_loadconstant()) {
    clear_layer();
    set_has_loadconstant();
    layer_.loadconstant_ = new ::CoreML::Specification::LoadConstantLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.loadConstant)
  return layer_.loadconstant_;
}